

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetaction.cpp
# Opt level: O3

void __thiscall QWidgetAction::~QWidgetAction(QWidgetAction *this)

{
  long lVar1;
  QArrayData *pQVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007ec610;
  lVar1 = *(long *)&this->field_0x8;
  lVar3 = *(long *)(lVar1 + 0x1c0);
  lVar5 = *(long *)(lVar1 + 0x1c8);
  if (lVar5 == 0) {
    lVar5 = 0;
  }
  else {
    lVar4 = 0;
    do {
      local_48 = QObject::destroyed;
      local_40 = 0;
      local_58 = QWidgetActionPrivate::widgetDestroyed;
      local_50 = 0;
      QObject::disconnectImpl
                (*(QObject **)(lVar3 + lVar4),&local_48,*(QObject **)(lVar1 + 8),&local_58,
                 (QMetaObject *)&QObject::staticMetaObject);
      lVar4 = lVar4 + 8;
    } while (lVar5 << 3 != lVar4);
    lVar3 = *(long *)(lVar1 + 0x1c0);
    lVar5 = *(long *)(lVar1 + 0x1c8);
  }
  pQVar2 = &((((QList<QWidget_*> *)(lVar1 + 0x1b8))->d).d)->super_QArrayData;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QList<QWidget_*>::clear((QList<QWidget_*> *)(lVar1 + 0x1b8));
  if (lVar5 != 0) {
    lVar4 = 0;
    do {
      if (*(long **)(lVar3 + lVar4) != (long *)0x0) {
        (**(code **)(**(long **)(lVar3 + lVar4) + 0x20))();
      }
      lVar4 = lVar4 + 8;
    } while (lVar5 * 8 != lVar4);
  }
  if (((*(long *)(lVar1 + 0x1a8) != 0) && (*(int *)(*(long *)(lVar1 + 0x1a8) + 4) != 0)) &&
     (*(long **)(lVar1 + 0x1b0) != (long *)0x0)) {
    (**(code **)(**(long **)(lVar1 + 0x1b0) + 0x20))();
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,8,0x10);
    }
  }
  QAction::~QAction(&this->super_QAction);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetAction::~QWidgetAction()
{
    Q_D(QWidgetAction);
    for (QWidget *w : std::as_const(d->createdWidgets))
        QObjectPrivate::disconnect(w, &QWidget::destroyed,
                                   d, &QWidgetActionPrivate::widgetDestroyed);
    QList<QWidget *> widgetsToDelete = d->createdWidgets;
    d->createdWidgets.clear();
    qDeleteAll(widgetsToDelete);
    delete d->defaultWidget;
}